

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readDbPage(PgHdr *pPg)

{
  u16 uVar1;
  Pager *pPVar2;
  sqlite3_file *psVar3;
  undefined8 uVar4;
  uint in_EAX;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  u32 iFrame;
  undefined8 uStack_18;
  
  pPVar2 = pPg->pPager;
  uStack_18 = (ulong)in_EAX;
  if (pPVar2->pWal != (Wal *)0x0) {
    iVar5 = sqlite3WalFindFrame(pPVar2->pWal,pPg->pgno,(u32 *)((long)&uStack_18 + 4));
    if (iVar5 != 0) {
      return iVar5;
    }
    if (uStack_18._4_4_ != 0) {
      psVar3 = pPVar2->pWal->pWalFd;
      uVar1 = (pPVar2->pWal->hdr).szPage;
      uVar7 = CONCAT22(uVar1,uVar1) & 0x1fe00;
      uVar8 = uVar7;
      if (pPVar2->pageSize <= (int)uVar7) {
        uVar8 = pPVar2->pageSize;
      }
      iVar5 = (*psVar3->pMethods->xRead)
                        (psVar3,pPg->pData,uVar8,
                         (ulong)(uVar7 + 0x18) * (ulong)(uStack_18._4_4_ - 1) + 0x38);
      goto LAB_00137895;
    }
  }
  iVar6 = (*pPVar2->fd->pMethods->xRead)
                    (pPVar2->fd,pPg->pData,pPVar2->pageSize,
                     (ulong)(pPg->pgno - 1) * (long)pPVar2->pageSize);
  iVar5 = 0;
  if (iVar6 != 0x20a) {
    iVar5 = iVar6;
  }
LAB_00137895:
  if (pPg->pgno == 1) {
    if (iVar5 == 0) {
      uVar4 = *(undefined8 *)((long)pPg->pData + 0x20);
      *(undefined8 *)pPVar2->dbFileVers = *(undefined8 *)((long)pPg->pData + 0x18);
      *(undefined8 *)(pPVar2->dbFileVers + 8) = uVar4;
      iVar5 = 0;
    }
    else {
      pPVar2->dbFileVers[0] = -1;
      pPVar2->dbFileVers[1] = -1;
      pPVar2->dbFileVers[2] = -1;
      pPVar2->dbFileVers[3] = -1;
      pPVar2->dbFileVers[4] = -1;
      pPVar2->dbFileVers[5] = -1;
      pPVar2->dbFileVers[6] = -1;
      pPVar2->dbFileVers[7] = -1;
      pPVar2->dbFileVers[8] = -1;
      pPVar2->dbFileVers[9] = -1;
      pPVar2->dbFileVers[10] = -1;
      pPVar2->dbFileVers[0xb] = -1;
      pPVar2->dbFileVers[0xc] = -1;
      pPVar2->dbFileVers[0xd] = -1;
      pPVar2->dbFileVers[0xe] = -1;
      pPVar2->dbFileVers[0xf] = -1;
    }
  }
  return iVar5;
}

Assistant:

static int readDbPage(PgHdr *pPg){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  int rc = SQLITE_OK;          /* Return code */

#ifndef SQLITE_OMIT_WAL
  u32 iFrame = 0;              /* Frame of WAL containing pgno */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

  if( pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pPg->pgno, &iFrame);
    if( rc ) return rc;
  }
  if( iFrame ){
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame,pPager->pageSize,pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pPg->pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pPager->pageSize, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pPg->pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noise equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  CODEC1(pPager, pPg->pData, pPg->pgno, 3, rc = SQLITE_NOMEM_BKPT);

  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pPg->pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pPg->pgno, pager_pagehash(pPg)));

  return rc;
}